

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::log_internal::EncodeBytesTruncate
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  size_t size;
  size_t size_00;
  Span<char> *this_00;
  pointer value_00;
  size_type n;
  pointer pcVar1;
  pointer n_00;
  Span<const_char> local_48;
  uint64_t local_38;
  
  this_00 = (Span<char> *)value.len_;
  value_00 = value.ptr_;
  local_38 = (long)this * 8 + 2;
  local_48.ptr_ = (pointer)tag;
  local_48.len_ = (size_type)value_00;
  size = VarintSize(local_38);
  pcVar1 = (pointer)this_00->len_;
  if (value_00 <= (pointer)this_00->len_) {
    pcVar1 = value_00;
  }
  size_00 = VarintSize((uint64_t)pcVar1);
  pcVar1 = (pointer)(size_00 + size);
  n_00 = (pointer)this_00->len_;
  if ((pcVar1 <= n_00) &&
     (n = (long)(pcVar1 + (long)value_00) - (long)n_00, n_00 <= pcVar1 + (long)value_00 && n != 0))
  {
    Span<const_char>::remove_suffix(&local_48,n);
    n_00 = (pointer)this_00->len_;
    value_00 = (pointer)local_48.len_;
  }
  if (n_00 < pcVar1 + (long)value_00) {
    Span<char>::remove_suffix(this_00,(size_type)n_00);
  }
  else {
    anon_unknown_1::EncodeRawVarint(local_38,size,this_00);
    anon_unknown_1::EncodeRawVarint((uint64_t)value_00,size_00,this_00);
    memcpy(this_00->ptr_,local_48.ptr_,local_48.len_);
    Span<char>::remove_prefix(this_00,local_48.len_);
  }
  return pcVar1 + (long)value_00 <= n_00;
}

Assistant:

bool EncodeBytesTruncate(uint64_t tag, absl::Span<const char> value,
                         absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size =
      VarintSize(std::min<uint64_t>(length, buf->size()));
  if (tag_type_size + length_size <= buf->size() &&
      tag_type_size + length_size + value.size() > buf->size()) {
    value.remove_suffix(tag_type_size + length_size + value.size() -
                        buf->size());
    length = value.size();
  }
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}